

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnReloc
          (BinaryReaderObjdump *this,RelocType type,Offset offset,Index index,uint32_t addend)

{
  int32_t signed_addend;
  ulong uVar1;
  long lVar2;
  string_view sVar3;
  string_view sVar4;
  
  uVar1 = (ulong)addend;
  lVar2 = (this->super_BinaryReaderObjdumpBase).section_starts_
          [(this->super_BinaryReaderObjdumpBase).reloc_section_] + offset;
  if (type < (Last|TableIndexSLEB)) {
    PrintDetails(this,"   - %-18s offset=%#08zx(file=%#08zx) ",
                 *(undefined8 *)(g_reloc_type_name + (ulong)type * 8),offset,lVar2);
    if (type == TypeIndexLEB) {
      PrintDetails(this,"type=%u",(ulong)index);
      goto LAB_0011509c;
    }
  }
  else {
    PrintDetails(this,"   - %-18s offset=%#08zx(file=%#08zx) ","<error_reloc_type>",offset,lVar2);
  }
  sVar3 = BinaryReaderObjdumpBase::GetSymbolName
                    ((BinaryReaderObjdumpBase *)(this->super_BinaryReaderObjdumpBase).objdump_state_
                     ,index);
  sVar4 = BinaryReaderObjdumpBase::GetSymbolName
                    ((BinaryReaderObjdumpBase *)(this->super_BinaryReaderObjdumpBase).objdump_state_
                     ,index);
  PrintDetails(this,"symbol=%u <%.*s>",(ulong)index,sVar3._M_len & 0xffffffff,sVar4._M_str);
LAB_0011509c:
  if (addend != 0) {
    if ((int)addend < 0) {
      PrintDetails(this,"-");
      uVar1 = (ulong)-addend;
    }
    else {
      PrintDetails(this,"+");
    }
    PrintDetails(this,"%#x",uVar1);
  }
  PrintDetails(this,"\n");
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnReloc(RelocType type,
                                    Offset offset,
                                    Index index,
                                    uint32_t addend) {
  Offset total_offset = GetSectionStart(reloc_section_) + offset;
  PrintDetails("   - %-18s offset=%#08" PRIoffset "(file=%#08" PRIoffset ") ",
               GetRelocTypeName(type), offset, total_offset);
  if (type == RelocType::TypeIndexLEB) {
    PrintDetails("type=%" PRIindex, index);
  } else {
    PrintDetails("symbol=%" PRIindex " <" PRIstringview ">", index,
                 WABT_PRINTF_STRING_VIEW_ARG(GetSymbolName(index)));
  }

  if (addend) {
    int32_t signed_addend = static_cast<int32_t>(addend);
    if (signed_addend < 0) {
      PrintDetails("-");
      signed_addend = -signed_addend;
    } else {
      PrintDetails("+");
    }
    PrintDetails("%#x", signed_addend);
  }
  PrintDetails("\n");
  return Result::Ok;
}